

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

ValidateXrFlagsResult ValidateXrHandTrackingAimFlagsFB(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x200) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrHandTrackingAimFlagsFB(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_HAND_TRACKING_AIM_COMPUTED_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_COMPUTED_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_COMPUTED_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_VALID_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_VALID_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_VALID_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_INDEX_PINCHING_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_INDEX_PINCHING_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_INDEX_PINCHING_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_MIDDLE_PINCHING_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_MIDDLE_PINCHING_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_MIDDLE_PINCHING_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_RING_PINCHING_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_RING_PINCHING_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_RING_PINCHING_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_LITTLE_PINCHING_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_LITTLE_PINCHING_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_LITTLE_PINCHING_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_SYSTEM_GESTURE_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_SYSTEM_GESTURE_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_SYSTEM_GESTURE_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_DOMINANT_HAND_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_DOMINANT_HAND_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_DOMINANT_HAND_BIT_FB;
    }
    if ((int_value & XR_HAND_TRACKING_AIM_MENU_PRESSED_BIT_FB) != 0) {
        // Clear the value XR_HAND_TRACKING_AIM_MENU_PRESSED_BIT_FB since it is valid
        int_value &= ~XR_HAND_TRACKING_AIM_MENU_PRESSED_BIT_FB;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}